

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

AttConfig * __thiscall QPDFJob::AttConfig::moddate(AttConfig *this,string *parameter)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = QUtil::pdf_time_to_qpdf_time(parameter,(QPDFTime *)0x0);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_38,(string *)parameter);
    std::operator+(&bStack_58,&local_38," is not a valid PDF timestamp");
    usage(&bStack_58);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::string::_M_assign((string *)&(this->att).moddate);
  return this;
}

Assistant:

QPDFJob::AttConfig*
QPDFJob::AttConfig::moddate(std::string const& parameter)
{
    if (!QUtil::pdf_time_to_qpdf_time(parameter)) {
        usage(std::string(parameter) + " is not a valid PDF timestamp");
    }
    this->att.moddate = parameter;
    return this;
}